

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

long arti_cost(obj *otmp)

{
  obj *otmp_local;
  
  if (otmp->oartifact == '\0') {
    otmp_local = (obj *)(long)objects[otmp->otyp].oc_cost;
  }
  else if (artilist[(int)otmp->oartifact].cost == 0) {
    otmp_local = (obj *)((long)objects[otmp->otyp].oc_cost * 100);
  }
  else {
    otmp_local = (obj *)artilist[(int)otmp->oartifact].cost;
  }
  return (long)otmp_local;
}

Assistant:

long arti_cost(const struct obj *otmp)
{
	if (!otmp->oartifact)
	    return (long)objects[otmp->otyp].oc_cost;
	else if (artilist[(int) otmp->oartifact].cost)
	    return artilist[(int) otmp->oartifact].cost;
	else
	    return 100L * (long)objects[otmp->otyp].oc_cost;
}